

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseCpdRegion
          (FfsParser *this,UByteArray *region,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index)

{
  CBString *__return_storage_ptr__;
  int iVar1;
  anon_struct_4_3_7b74da23_for_Offset aVar2;
  anon_struct_4_3_7b74da23_for_Offset aVar3;
  TreeModel *pTVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  UByteArray *pUVar7;
  UINT8 UVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  UINT32 UVar13;
  int32_t iVar14;
  uint uVar15;
  char *pcVar16;
  size_type sVar17;
  ulong uVar18;
  reference pvVar19;
  int *piVar20;
  iterator __first;
  iterator __last;
  char *pcVar21;
  CBString local_a20;
  UModelIndex local_a08;
  UByteArray local_9f0;
  UByteArray local_9d0;
  CBString local_9b0;
  CBString local_998;
  CBString local_980;
  undefined1 local_968 [8];
  UByteArray partition_4;
  UByteArray local_928;
  CBString local_908;
  undefined1 local_8f0 [8];
  UModelIndex codeIndex;
  CBString local_8b8;
  CBString local_8a0;
  CBString local_888;
  undefined1 local_870 [8];
  UByteArray hash_1;
  CBString local_838;
  UByteArray local_820;
  UByteArray local_800;
  CBString local_7e0;
  undefined1 local_7c8 [8];
  UModelIndex partitionIndex_1;
  CBString local_790;
  CBString local_778;
  CBString local_760;
  undefined1 local_748 [8];
  UByteArray hash;
  CBString local_710;
  UByteArray local_6f8;
  CBString local_6d8;
  undefined1 local_6c0 [8];
  UModelIndex partitionIndex;
  undefined1 local_690 [8];
  UByteArray body_1;
  UByteArray header_1;
  CPD_MANIFEST_HEADER *manifestHeader;
  undefined1 local_630 [8];
  UByteArray partition_3;
  size_t i_3;
  const_iterator local_600;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_5f8;
  iterator iter;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_5e8;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_5e0;
  const_iterator local_5d8;
  CBString local_5d0;
  CPD_PARTITION_INFO_ *local_5b8;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_5b0;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_5a8;
  const_iterator local_5a0;
  CBString local_598;
  CBString local_580;
  CBString local_568;
  CBString local_550;
  CPD_PARTITION_INFO_ *local_538;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_530;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_528;
  const_iterator local_520;
  CBString local_518;
  uint local_4fc;
  ulong uStack_4f8;
  UINT32 previousPartitionEnd;
  size_t i_2;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_4e8;
  const_iterator local_4e0;
  CPD_PARTITION_INFO_ *local_4d8;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_4d0;
  const_iterator local_4c8;
  CBString local_4c0;
  undefined1 auStack_4a8 [8];
  CPD_PARTITION_INFO padding;
  CBString local_458;
  CBString local_440;
  undefined1 local_428 [8];
  CBString namej;
  UINT32 j;
  bool found;
  CPD_EXT_MODULE_ATTRIBUTES *attrHeader;
  CPD_EXTENTION_HEADER *extHeader;
  UByteArray partition_2;
  UINT32 length;
  UINT32 offset_1;
  uint local_3b4;
  iterator iStack_3b0;
  UINT32 i;
  __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
  local_3a8;
  int local_39c;
  UModelIndex local_398;
  UByteArray local_380;
  UByteArray local_360;
  CBString local_340;
  CBString local_328;
  CBString local_310;
  undefined1 local_2f8 [8];
  UByteArray partition_1;
  CPD_PARTITION_INFO partition;
  UByteArray local_280;
  CBString local_260;
  undefined1 auStack_248 [8];
  UModelIndex entryIndex;
  CBString local_218;
  CBString local_200;
  undefined1 local_1e8 [8];
  UByteArray entry;
  CPD_ENTRY *cpdEntry;
  UINT32 i_1;
  CPD_ENTRY *firstCpdEntry;
  undefined1 local_1a8 [4];
  UINT32 offset;
  vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> partitions;
  CBString local_170;
  UModelIndex local_158;
  undefined1 local_140 [8];
  CBString info;
  CBString name;
  UByteArray body;
  UByteArray header;
  UINT32 ptSize;
  UINT32 ptBodySize;
  UINT32 local_94;
  char *pcStack_90;
  UINT32 ptHeaderSize;
  CPD_REV1_HEADER *cpdHeader;
  CBString local_78;
  UModelIndex *local_60;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UByteArray *pUStack_48;
  UINT32 localOffset_local;
  UByteArray *region_local;
  FfsParser *this_local;
  
  local_60 = index;
  index_local = parent;
  parent_local._4_4_ = localOffset;
  pUStack_48 = region;
  region_local = (UByteArray *)this;
  uVar10 = UByteArray::size(region);
  if (uVar10 < 0x10) {
    usprintf(&local_78,"%s: CPD too small to fit rev1 partition table header","parseCpdRegion");
    msg(this,&local_78,index_local);
    Bstrlib::CBString::~CBString(&local_78);
    return (USTATUS)(FfsParser *)0xfd;
  }
  pcStack_90 = UByteArray::constData(pUStack_48);
  local_94 = 0;
  if (pcStack_90[8] == '\x02') {
    uVar10 = UByteArray::size(pUStack_48);
    if (uVar10 < 0x14) {
      usprintf((CBString *)&ptSize,"%s: CPD too small to fit rev2 partition table header",
               "parseCpdRegion");
      msg(this,(CBString *)&ptSize,index_local);
      Bstrlib::CBString::~CBString((CBString *)&ptSize);
      return (USTATUS)(FfsParser *)0xfd;
    }
    local_94 = 0x14;
  }
  else if (pcStack_90[8] == '\x01') {
    local_94 = 0x10;
  }
  iVar1 = *(int *)(pcStack_90 + 4);
  uVar10 = local_94 + iVar1 * 0x18;
  uVar11 = UByteArray::size(pUStack_48);
  if (uVar11 < uVar10) {
    __return_storage_ptr__ = (CBString *)((long)&header.d.field_2 + 8);
    usprintf(__return_storage_ptr__,"%s: CPD too small to fit the whole partition table",
             "parseCpdRegion");
    msg(this,__return_storage_ptr__,index_local);
    Bstrlib::CBString::~CBString((CBString *)((long)&header.d.field_2 + 8));
    return (USTATUS)(FfsParser *)0xfd;
  }
  UByteArray::left((UByteArray *)((long)&body.d.field_2 + 8),pUStack_48,local_94);
  UByteArray::mid((UByteArray *)&name.super_tagbstring.data,pUStack_48,local_94,iVar1 * 0x18);
  usprintf((CBString *)&info.super_tagbstring.data,"CPD partition table");
  uVar11 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
  uVar12 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
  UByteArray::size((UByteArray *)&name.super_tagbstring.data);
  UByteArray::size((UByteArray *)&name.super_tagbstring.data);
  usprintf((CBString *)local_140,
           "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\nHeader version: %u\nEntry version: %u"
           ,(ulong)uVar10,(ulong)uVar10,(ulong)uVar11,(ulong)uVar12);
  UVar13 = parent_local._4_4_;
  pTVar4 = this->model;
  Bstrlib::CBString::CBString(&local_170);
  UByteArray::UByteArray
            ((UByteArray *)
             &partitions.
              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TreeModel::addItem(&local_158,pTVar4,UVar13,'_','\0',(CBString *)&info.super_tagbstring.data,
                     &local_170,(CBString *)local_140,(UByteArray *)((long)&body.d.field_2 + 8),
                     (UByteArray *)&name.super_tagbstring.data,
                     (UByteArray *)
                     &partitions.
                      super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,Fixed,index_local,'\0');
  local_60->m = local_158.m;
  local_60->r = local_158.r;
  local_60->c = local_158.c;
  local_60->i = local_158.i;
  UByteArray::~UByteArray
            ((UByteArray *)
             &partitions.
              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Bstrlib::CBString::~CBString(&local_170);
  std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::vector
            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)local_1a8);
  firstCpdEntry._4_4_ = local_94;
  pcVar16 = UByteArray::constData((UByteArray *)&name.super_tagbstring.data);
  for (cpdEntry._4_4_ = 0; cpdEntry._4_4_ < *(uint *)(pcStack_90 + 4);
      cpdEntry._4_4_ = cpdEntry._4_4_ + 1) {
    entry.d.field_2._8_8_ = pcVar16 + (ulong)cpdEntry._4_4_ * 0x18;
    UByteArray::UByteArray((UByteArray *)local_1e8,(char *)entry.d.field_2._8_8_,0x18);
    usprintf(&local_200,"%.12s",entry.d.field_2._8_8_);
    Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_200);
    Bstrlib::CBString::~CBString(&local_200);
    uVar11 = UByteArray::size((UByteArray *)local_1e8);
    uVar12 = UByteArray::size((UByteArray *)local_1e8);
    usprintf((CBString *)&entryIndex.m,
             "Full size: %Xh (%u)\nEntry offset: %Xh\nEntry length: %Xh\nHuffman compressed: ",
             (ulong)uVar11,(ulong)uVar12,(ulong)(*(uint *)(entry.d.field_2._8_8_ + 0xc) & 0x1ffffff)
             ,(ulong)*(uint *)(entry.d.field_2._8_8_ + 0x10));
    pcVar21 = "No";
    if ((*(uint *)(entry.d.field_2._8_8_ + 0xc) >> 0x19 & 1) != 0) {
      pcVar21 = "Yes";
    }
    Bstrlib::CBString::operator+(&local_218,(CBString *)&entryIndex.m,pcVar21);
    Bstrlib::CBString::operator=((CBString *)local_140,&local_218);
    Bstrlib::CBString::~CBString(&local_218);
    Bstrlib::CBString::~CBString((CBString *)&entryIndex.m);
    pTVar4 = this->model;
    Bstrlib::CBString::CBString(&local_260);
    UByteArray::UByteArray(&local_280);
    UByteArray::UByteArray((UByteArray *)&partition.index.m);
    TreeModel::addItem((UModelIndex *)auStack_248,pTVar4,firstCpdEntry._4_4_,'`','\0',
                       (CBString *)&info.super_tagbstring.data,&local_260,(CBString *)local_140,
                       &local_280,(UByteArray *)local_1e8,(UByteArray *)&partition.index.m,Fixed,
                       local_60,'\0');
    UByteArray::~UByteArray((UByteArray *)&partition.index.m);
    UByteArray::~UByteArray(&local_280);
    Bstrlib::CBString::~CBString(&local_260);
    firstCpdEntry._4_4_ = firstCpdEntry._4_4_ + 0x18;
    if (((*(uint *)(entry.d.field_2._8_8_ + 0xc) & 0x1ffffff) != 0) &&
       (*(int *)(entry.d.field_2._8_8_ + 0x10) != 0)) {
      CPD_PARTITION_INFO_::CPD_PARTITION_INFO_
                ((CPD_PARTITION_INFO_ *)((long)&partition_1.d.field_2 + 8));
      partition.ptEntry.Length._0_1_ = 0x61;
      partition.ptEntry._8_8_ = *(undefined8 *)(entry.d.field_2._8_8_ + 0x10);
      partition_1.d.field_2._8_8_ = *entry.d.field_2._8_8_;
      partition.ptEntry.EntryName._0_8_ = *(undefined8 *)(entry.d.field_2._8_8_ + 8);
      partition.index.i = entryIndex.i;
      partition.type = auStack_248[0];
      partition.hasMetaData = (bool)auStack_248[1];
      partition._26_6_ = auStack_248._2_6_;
      partition.index.r = entryIndex.r;
      partition.index.c = entryIndex.c;
      partition.ptEntry.Length._1_1_ = 0;
      std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::push_back
                ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)local_1a8,
                 (value_type *)((long)&partition_1.d.field_2 + 8));
    }
    UByteArray::~UByteArray((UByteArray *)local_1e8);
  }
  sVar17 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::size
                     ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)local_1a8
                     );
  if (sVar17 == 0) {
    UByteArray::mid((UByteArray *)local_2f8,pUStack_48,uVar10,-1);
    Bstrlib::CBString::CBString(&local_310,"Padding");
    Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_310);
    Bstrlib::CBString::~CBString(&local_310);
    uVar11 = UByteArray::size((UByteArray *)local_2f8);
    uVar12 = UByteArray::size((UByteArray *)local_2f8);
    usprintf(&local_328,"Full size: %Xh (%u)",(ulong)uVar11,(ulong)uVar12);
    Bstrlib::CBString::operator=((CBString *)local_140,&local_328);
    Bstrlib::CBString::~CBString(&local_328);
    pTVar4 = this->model;
    UVar13 = parent_local._4_4_ + uVar10;
    UVar8 = getPaddingType((UByteArray *)local_2f8);
    Bstrlib::CBString::CBString(&local_340);
    UByteArray::UByteArray(&local_360);
    UByteArray::UByteArray(&local_380);
    TreeModel::addItem(&local_398,pTVar4,UVar13,'@',UVar8,(CBString *)&info.super_tagbstring.data,
                       &local_340,(CBString *)local_140,&local_360,(UByteArray *)local_2f8,
                       &local_380,Fixed,index_local,'\0');
    UByteArray::~UByteArray(&local_380);
    UByteArray::~UByteArray(&local_360);
    Bstrlib::CBString::~CBString(&local_340);
    this_local = (FfsParser *)0x0;
    local_39c = 1;
    UByteArray::~UByteArray((UByteArray *)local_2f8);
  }
  else {
    local_3a8._M_current =
         (CPD_PARTITION_INFO_ *)
         std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::begin
                   ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)local_1a8);
    iStack_3b0 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::end
                           ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                            local_1a8);
    std::
    sort<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>>
              (local_3a8,
               (__normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
                )iStack_3b0._M_current);
    local_3b4 = 1;
    while (uVar18 = (ulong)local_3b4,
          sVar17 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::size
                             ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                              local_1a8), uVar18 < sVar17) {
      pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                          ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                           local_1a8,(ulong)local_3b4);
      usprintf((CBString *)&length,"%.12s",pvVar19);
      Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,(CBString *)&length);
      Bstrlib::CBString::~CBString((CBString *)&length);
      bVar9 = Bstrlib::CBString::endsWith((CBString *)&info.super_tagbstring.data,".met");
      pUVar7 = pUStack_48;
      if (!bVar9) break;
      partition_2.d.field_2._12_4_ = 0;
      partition_2.d.field_2._8_4_ = 0xffffffff;
      pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                          ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                           local_1a8,(ulong)local_3b4);
      aVar2 = (pvVar19->ptEntry).Offset;
      pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                          ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                           local_1a8,(ulong)local_3b4);
      UByteArray::mid((UByteArray *)&extHeader,pUVar7,(uint)aVar2 & 0x1ffffff,
                      (pvVar19->ptEntry).Length);
      for (; uVar6 = partition_2.d.field_2._12_4_,
          uVar11 = UByteArray::size((UByteArray *)&extHeader), (uint)uVar6 < uVar11;
          partition_2.d.field_2._12_4_ = piVar20[1] + partition_2.d.field_2._12_4_) {
        pcVar16 = UByteArray::constData((UByteArray *)&extHeader);
        piVar20 = (int *)(pcVar16 + (uint)partition_2.d.field_2._12_4_);
        uVar11 = piVar20[1];
        iVar14 = UByteArray::size((UByteArray *)&extHeader);
        if ((uint)(iVar14 - partition_2.d.field_2._12_4_) < uVar11) break;
        if (*piVar20 == 10) {
          pcVar16 = UByteArray::constData((UByteArray *)&extHeader);
          partition_2.d.field_2._8_4_ =
               *(undefined4 *)(pcVar16 + (ulong)(uint)partition_2.d.field_2._12_4_ + 0x10);
        }
      }
      Bstrlib::CBString::chop((CBString *)&info.super_tagbstring.data,4);
      namej.super_tagbstring.data._7_1_ = 0;
      namej.super_tagbstring.data._0_4_ = 1;
      do {
        uVar18 = (ulong)(uint)namej.super_tagbstring.data;
        sVar17 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::size
                           ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                            local_1a8);
        if (sVar17 <= uVar18) break;
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8,(ulong)(uint)namej.super_tagbstring.data);
        usprintf((CBString *)local_428,"%.12s",pvVar19);
        bVar9 = Bstrlib::CBString::operator==
                          ((CBString *)&info.super_tagbstring.data,(CBString *)local_428);
        if (bVar9) {
          namej.super_tagbstring.data._7_1_ = 1;
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,(ulong)(uint)namej.super_tagbstring.data);
          uVar6 = partition_2.d.field_2._8_4_;
          if (((uint)(pvVar19->ptEntry).Offset >> 0x19 & 1) == 0) {
            if ((partition_2.d.field_2._8_4_ != -1) &&
               (pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                          operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                      *)local_1a8,(ulong)(uint)namej.super_tagbstring.data),
               (pvVar19->ptEntry).Length != partition_2.d.field_2._8_4_)) {
              pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                        operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    *)local_1a8,(ulong)(uint)namej.super_tagbstring.data);
              usprintf(&local_440,
                       "%s: partition size mismatch between partition table (%Xh) and partition metadata (%Xh)"
                       ,"parseCpdRegion",(ulong)(pvVar19->ptEntry).Length,
                       (ulong)(uint)partition_2.d.field_2._8_4_);
              pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                        operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    *)local_1a8,(ulong)(uint)namej.super_tagbstring.data);
              msg(this,&local_440,&pvVar19->index);
              Bstrlib::CBString::~CBString(&local_440);
              uVar6 = partition_2.d.field_2._8_4_;
              pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                        operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    *)local_1a8,(ulong)(uint)namej.super_tagbstring.data);
              (pvVar19->ptEntry).Length = uVar6;
            }
          }
          else {
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,(ulong)(uint)namej.super_tagbstring.data);
            (pvVar19->ptEntry).Length = uVar6;
          }
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,(ulong)(uint)namej.super_tagbstring.data);
          pvVar19->hasMetaData = true;
          local_39c = 10;
        }
        else {
          namej.super_tagbstring.data._0_4_ = (uint)namej.super_tagbstring.data + 1;
          local_39c = 0;
        }
        Bstrlib::CBString::~CBString((CBString *)local_428);
      } while (local_39c == 0);
      if ((namej.super_tagbstring.data._7_1_ & 1) == 0) {
        usprintf(&local_458,"%s: no code partition","parseCpdRegion");
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8,(ulong)local_3b4);
        msg(this,&local_458,&pvVar19->index);
        Bstrlib::CBString::~CBString(&local_458);
      }
      local_3b4 = local_3b4 + 1;
      UByteArray::~UByteArray((UByteArray *)&extHeader);
    }
LAB_0016329b:
    bVar9 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::empty
                      ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                       local_1a8);
    if (!bVar9) {
      __first = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::begin
                          ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                           local_1a8);
      __last = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::end
                         ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                          local_1a8);
      std::
      sort<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>>
                ((__normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
                  )__first._M_current,
                 (__normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
                  )__last._M_current);
      padding.type = '\0';
      padding.hasMetaData = false;
      padding._26_6_ = 0;
      padding.index.r = 0;
      padding.index.c = 0;
      padding.ptEntry.EntryName[8] = '\0';
      padding.ptEntry.EntryName[9] = '\0';
      padding.ptEntry.EntryName[10] = '\0';
      padding.ptEntry.EntryName[0xb] = '\0';
      padding.ptEntry.Offset = (anon_struct_4_3_7b74da23_for_Offset)0x0;
      padding.ptEntry.Length = 0;
      padding.ptEntry.Reserved = 0;
      auStack_4a8[0] = '\0';
      auStack_4a8[1] = '\0';
      auStack_4a8[2] = '\0';
      auStack_4a8[3] = '\0';
      auStack_4a8[4] = '\0';
      auStack_4a8[5] = '\0';
      auStack_4a8[6] = '\0';
      auStack_4a8[7] = '\0';
      padding.ptEntry.EntryName[0] = '\0';
      padding.ptEntry.EntryName[1] = '\0';
      padding.ptEntry.EntryName[2] = '\0';
      padding.ptEntry.EntryName[3] = '\0';
      padding.ptEntry.EntryName[4] = '\0';
      padding.ptEntry.EntryName[5] = '\0';
      padding.ptEntry.EntryName[6] = '\0';
      padding.ptEntry.EntryName[7] = '\0';
      padding.index.i = 0;
      CPD_PARTITION_INFO_::CPD_PARTITION_INFO_((CPD_PARTITION_INFO_ *)auStack_4a8);
      pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::front
                          ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                           local_1a8);
      if (((uint)(pvVar19->ptEntry).Offset & 0x1ffffff) < uVar10) {
        usprintf(&local_4c0,"%s: CPD partition has intersection with CPD partition table, skipped",
                 "parseCpdRegion");
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::front
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8);
        msg(this,&local_4c0,&pvVar19->index);
        Bstrlib::CBString::~CBString(&local_4c0);
        local_4d0._M_current =
             (CPD_PARTITION_INFO_ *)
             std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::begin
                       ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                        local_1a8);
        __gnu_cxx::
        __normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
        ::__normal_iterator<CPD_PARTITION_INFO_*>
                  ((__normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
                    *)&local_4c8,&local_4d0);
        local_4d8 = (CPD_PARTITION_INFO_ *)
                    std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::erase
                              ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,local_4c8);
      }
      else {
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::front
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8);
        if (uVar10 < ((uint)(pvVar19->ptEntry).Offset & 0x1ffffff)) {
          uVar11 = padding.ptEntry.EntryName._4_4_ & 0xfe000000 | uVar10 & 0x1ffffff;
          padding.ptEntry.EntryName[4] = (char)uVar11;
          padding.ptEntry.EntryName[5] = (char)(uVar11 >> 8);
          padding.ptEntry.EntryName[6] = (char)(uVar11 >> 0x10);
          padding.ptEntry.EntryName[7] = (char)(uVar11 >> 0x18);
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::front
                              ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8);
          padding.ptEntry.EntryName._8_4_ =
               ((uint)(pvVar19->ptEntry).Offset & 0x1ffffff) -
               (padding.ptEntry.EntryName._4_4_ & 0x1ffffff);
          padding.ptEntry.Length._0_1_ = 0x40;
          local_4e8._M_current =
               (CPD_PARTITION_INFO_ *)
               std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::begin
                         ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                          local_1a8);
          __gnu_cxx::
          __normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
          ::__normal_iterator<CPD_PARTITION_INFO_*>
                    ((__normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
                      *)&local_4e0,&local_4e8);
          i_2 = (size_t)std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                        insert((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,local_4e0,(value_type *)auStack_4a8);
        }
        uStack_4f8 = 1;
        while( true ) {
          uVar18 = uStack_4f8;
          sVar17 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::size
                             ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                              local_1a8);
          if (sVar17 <= uVar18) {
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::back
                                ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8);
            aVar2 = (pvVar19->ptEntry).Offset;
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::back
                                ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8);
            uVar10 = (pvVar19->ptEntry).Length;
            iVar14 = UByteArray::size(pUStack_48);
            if ((ulong)((uint)aVar2 & 0x1ffffff) + (ulong)uVar10 < (ulong)(long)iVar14) {
              pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::back
                                  ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    *)local_1a8);
              aVar2 = (pvVar19->ptEntry).Offset;
              pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::back
                                  ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    *)local_1a8);
              uVar10 = padding.ptEntry.EntryName._4_4_ & 0xfe000000 |
                       (int)aVar2 + (pvVar19->ptEntry).Length & 0x1ffffff;
              padding.ptEntry.EntryName[4] = (char)uVar10;
              padding.ptEntry.EntryName[5] = (char)(uVar10 >> 8);
              padding.ptEntry.EntryName[6] = (char)(uVar10 >> 0x10);
              padding.ptEntry.EntryName[7] = (char)(uVar10 >> 0x18);
              iVar14 = UByteArray::size(pUStack_48);
              padding.ptEntry.EntryName._8_4_ =
                   iVar14 - (padding.ptEntry.EntryName._4_4_ & 0x1ffffff);
              padding.ptEntry.Length._0_1_ = 0x40;
              std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::push_back
                        ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                         local_1a8,(value_type *)auStack_4a8);
            }
            partition_3.d.field_2._8_8_ = 0;
            goto LAB_00163e50;
          }
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8 - 1);
          aVar2 = (pvVar19->ptEntry).Offset;
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8 - 1);
          local_4fc = ((uint)aVar2 & 0x1ffffff) + (pvVar19->ptEntry).Length;
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8);
          aVar2 = (pvVar19->ptEntry).Offset;
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8);
          uVar11 = (pvVar19->ptEntry).Length;
          iVar14 = UByteArray::size(pUStack_48);
          if ((ulong)(long)iVar14 < (ulong)((uint)aVar2 & 0x1ffffff) + (ulong)uVar11) {
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,uStack_4f8);
            aVar2 = (pvVar19->ptEntry).Offset;
            iVar14 = UByteArray::size(pUStack_48);
            if ((ulong)(long)iVar14 <= (ulong)((uint)aVar2 & 0x1ffffff)) {
              usprintf(&local_518,
                       "%s: CPD partition is located outside of the opened image, skipped",
                       "parseCpdRegion");
              pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                        operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    *)local_1a8,uStack_4f8);
              msg(this,&local_518,&pvVar19->index);
              Bstrlib::CBString::~CBString(&local_518);
              local_530._M_current =
                   (CPD_PARTITION_INFO_ *)
                   std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::begin
                             ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                              local_1a8);
              local_528 = __gnu_cxx::
                          __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
                          ::operator+(&local_530,uStack_4f8);
              __gnu_cxx::
              __normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
              ::__normal_iterator<CPD_PARTITION_INFO_*>
                        ((__normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
                          *)&local_520,&local_528);
              local_538 = (CPD_PARTITION_INFO_ *)
                          std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                          erase((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *
                                )local_1a8,local_520);
              goto LAB_0016329b;
            }
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,uStack_4f8);
            if (((pvVar19->hasMetaData & 1U) == 0) &&
               (pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                          operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                      *)local_1a8,uStack_4f8),
               ((uint)(pvVar19->ptEntry).Offset >> 0x19 & 1) != 0)) {
              usprintf(&local_550,
                       "%s: CPD partition is compressed but doesn\'t have metadata and can\'t fit into its region, length adjusted"
                       ,"parseCpdRegion");
              pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                        operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    *)local_1a8,uStack_4f8);
              msg(this,&local_550,&pvVar19->index);
              Bstrlib::CBString::~CBString(&local_550);
            }
            else {
              usprintf(&local_568,"%s: CPD partition can\'t fit into its region, truncated",
                       "parseCpdRegion");
              pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                        operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    *)local_1a8,uStack_4f8);
              msg(this,&local_568,&pvVar19->index);
              Bstrlib::CBString::~CBString(&local_568);
            }
            iVar14 = UByteArray::size(pUStack_48);
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,uStack_4f8);
            aVar2 = (pvVar19->ptEntry).Offset;
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,uStack_4f8);
            (pvVar19->ptEntry).Length = iVar14 - ((uint)aVar2 & 0x1ffffff);
          }
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8);
          if (((uint)(pvVar19->ptEntry).Offset & 0x1ffffff) < local_4fc) break;
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8);
          if (local_4fc < ((uint)(pvVar19->ptEntry).Offset & 0x1ffffff)) {
            uVar11 = padding.ptEntry.EntryName._4_4_ & 0xfe000000 | local_4fc & 0x1ffffff;
            padding.ptEntry.EntryName[4] = (char)uVar11;
            padding.ptEntry.EntryName[5] = (char)(uVar11 >> 8);
            padding.ptEntry.EntryName[6] = (char)(uVar11 >> 0x10);
            padding.ptEntry.EntryName[7] = (char)(uVar11 >> 0x18);
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,uStack_4f8);
            padding.ptEntry.EntryName._8_4_ =
                 ((uint)(pvVar19->ptEntry).Offset & 0x1ffffff) - local_4fc;
            padding.ptEntry.Length._0_1_ = 0x40;
            local_5f8._M_current =
                 (CPD_PARTITION_INFO_ *)
                 std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::begin
                           ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                            local_1a8);
            std::
            advance<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>,unsigned_long>
                      (&local_5f8,uStack_4f8);
            __gnu_cxx::
            __normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
            ::__normal_iterator<CPD_PARTITION_INFO_*>
                      ((__normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
                        *)&local_600,&local_5f8);
            std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::insert
                      ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                       local_1a8,local_600,(value_type *)auStack_4a8);
          }
          uStack_4f8 = uStack_4f8 + 1;
        }
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8,uStack_4f8 - 1);
        if (((pvVar19->hasMetaData & 1U) == 0) &&
           (pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,uStack_4f8 - 1),
           ((uint)(pvVar19->ptEntry).Offset >> 0x19 & 1) != 0)) {
          usprintf(&local_580,
                   "%s: CPD partition is compressed but doesn\'t have metadata, length adjusted",
                   "parseCpdRegion");
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8 - 1);
          msg(this,&local_580,&pvVar19->index);
          Bstrlib::CBString::~CBString(&local_580);
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8);
          aVar2 = (pvVar19->ptEntry).Offset;
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8 - 1);
          aVar3 = (pvVar19->ptEntry).Offset;
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8 - 1);
          (pvVar19->ptEntry).Length = ((uint)aVar2 & 0x1ffffff) - ((uint)aVar3 & 0x1ffffff);
        }
        else {
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8);
          aVar2 = (pvVar19->ptEntry).Offset;
          pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                    operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                               local_1a8,uStack_4f8);
          if (local_4fc < ((uint)aVar2 & 0x1ffffff) + (pvVar19->ptEntry).Length) {
            usprintf(&local_5d0,"%s: CPD partition intersects with previous one, skipped",
                     "parseCpdRegion");
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,uStack_4f8);
            msg(this,&local_5d0,&pvVar19->index);
            Bstrlib::CBString::~CBString(&local_5d0);
            local_5e8._M_current =
                 (CPD_PARTITION_INFO_ *)
                 std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::begin
                           ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                            local_1a8);
            local_5e0 = __gnu_cxx::
                        __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
                        ::operator+(&local_5e8,uStack_4f8);
            __gnu_cxx::
            __normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
            ::__normal_iterator<CPD_PARTITION_INFO_*>
                      ((__normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
                        *)&local_5d8,&local_5e0);
            iter = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::erase
                             ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                              local_1a8,local_5d8);
          }
          else {
            usprintf(&local_598,"%s: CPD partition is located inside another CPD partition, skipped"
                     ,"parseCpdRegion");
            pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                      operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  *)local_1a8,uStack_4f8);
            msg(this,&local_598,&pvVar19->index);
            Bstrlib::CBString::~CBString(&local_598);
            local_5b0._M_current =
                 (CPD_PARTITION_INFO_ *)
                 std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::begin
                           ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                            local_1a8);
            local_5a8 = __gnu_cxx::
                        __normal_iterator<CPD_PARTITION_INFO__*,_std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>_>
                        ::operator+(&local_5b0,uStack_4f8);
            __gnu_cxx::
            __normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
            ::__normal_iterator<CPD_PARTITION_INFO_*>
                      ((__normal_iterator<CPD_PARTITION_INFO_const*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>
                        *)&local_5a0,&local_5a8);
            local_5b8 = (CPD_PARTITION_INFO_ *)
                        std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                        erase((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                              local_1a8,local_5a0);
          }
        }
      }
      goto LAB_0016329b;
    }
    this_local = (FfsParser *)0xfd;
    local_39c = 1;
  }
LAB_00165036:
  std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::~vector
            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)local_1a8);
  Bstrlib::CBString::~CBString((CBString *)local_140);
  Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
  UByteArray::~UByteArray((UByteArray *)&name.super_tagbstring.data);
  UByteArray::~UByteArray((UByteArray *)((long)&body.d.field_2 + 8));
  return (USTATUS)this_local;
LAB_00163e50:
  uVar5 = partition_3.d.field_2._8_8_;
  sVar17 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::size
                     ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)local_1a8
                     );
  if (sVar17 <= (ulong)uVar5) goto LAB_00165024;
  pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                      ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                       local_1a8,partition_3.d.field_2._8_8_);
  pUVar7 = pUStack_48;
  if (pvVar19->type == 'a') {
    pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                        ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                         local_1a8,partition_3.d.field_2._8_8_);
    aVar2 = (pvVar19->ptEntry).Offset;
    pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                        ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                         local_1a8,partition_3.d.field_2._8_8_);
    UByteArray::mid((UByteArray *)local_630,pUVar7,(uint)aVar2 & 0x1ffffff,(pvVar19->ptEntry).Length
                   );
    pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                        ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                         local_1a8,partition_3.d.field_2._8_8_);
    usprintf((CBString *)&manifestHeader,"%.12s",pvVar19);
    Bstrlib::CBString::operator=
              ((CBString *)&info.super_tagbstring.data,(CBString *)&manifestHeader);
    Bstrlib::CBString::~CBString((CBString *)&manifestHeader);
    bVar9 = Bstrlib::CBString::endsWith((CBString *)&info.super_tagbstring.data,".man");
    if (bVar9) {
      pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                          ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                           local_1a8,partition_3.d.field_2._8_8_);
      if (((((uint)(pvVar19->ptEntry).Offset >> 0x19 & 1) == 0) &&
          (pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::
                     operator[]((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *
                                )local_1a8,partition_3.d.field_2._8_8_),
          0x7f < (pvVar19->ptEntry).Length)) &&
         (pcVar16 = UByteArray::constData((UByteArray *)local_630),
         *(int *)(pcVar16 + 0x1c) == 0x324e4d24)) {
        UByteArray::left((UByteArray *)((long)&body_1.d.field_2 + 8),(UByteArray *)local_630,
                         *(int *)(pcVar16 + 4) << 2);
        UByteArray::mid((UByteArray *)local_690,(UByteArray *)local_630,*(int *)(pcVar16 + 4) << 2,
                        -1);
        uVar10 = UByteArray::size((UByteArray *)local_630);
        uVar11 = UByteArray::size((UByteArray *)local_630);
        uVar12 = UByteArray::size((UByteArray *)((long)&body_1.d.field_2 + 8));
        uVar15 = UByteArray::size((UByteArray *)((long)&body_1.d.field_2 + 8));
        UByteArray::size((UByteArray *)local_690);
        UByteArray::size((UByteArray *)local_690);
        usprintf((CBString *)&partitionIndex.m,
                 "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nHeader type: %u\nHeader length: %Xh (%u)\nHeader version: %Xh\nFlags: %08Xh\nVendor: %Xh\nDate: %Xh\nSize: %Xh (%u)\nVersion: %u.%u.%u.%u\nSecurity version number: %u\nModulus size: %Xh (%u)\nExponent size: %Xh (%u)"
                 ,(ulong)uVar10,(ulong)uVar11,(ulong)uVar12,(ulong)uVar15);
        Bstrlib::CBString::operator=((CBString *)local_140,(CBString *)&partitionIndex.m);
        Bstrlib::CBString::~CBString((CBString *)&partitionIndex.m);
        UVar13 = parent_local._4_4_;
        pTVar4 = this->model;
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8,partition_3.d.field_2._8_8_);
        aVar2 = (pvVar19->ptEntry).Offset;
        Bstrlib::CBString::CBString(&local_6d8);
        UByteArray::UByteArray(&local_6f8);
        TreeModel::addItem((UModelIndex *)local_6c0,pTVar4,UVar13 + ((uint)aVar2 & 0x1ffffff),'a',
                           0xe6,(CBString *)&info.super_tagbstring.data,&local_6d8,
                           (CBString *)local_140,(UByteArray *)((long)&body_1.d.field_2 + 8),
                           (UByteArray *)local_690,&local_6f8,Fixed,index_local,'\0');
        UByteArray::~UByteArray(&local_6f8);
        Bstrlib::CBString::~CBString(&local_6d8);
        UVar13 = UByteArray::size((UByteArray *)((long)&body_1.d.field_2 + 8));
        parseCpdExtensionsArea(this,(UModelIndex *)local_6c0,UVar13);
        UByteArray::~UByteArray((UByteArray *)local_690);
        UByteArray::~UByteArray((UByteArray *)((long)&body_1.d.field_2 + 8));
      }
    }
    else {
      bVar9 = Bstrlib::CBString::endsWith((CBString *)&info.super_tagbstring.data,".met");
      if (bVar9) {
        uVar10 = UByteArray::size((UByteArray *)local_630);
        uVar11 = UByteArray::size((UByteArray *)local_630);
        usprintf((CBString *)((long)&hash.d.field_2 + 8),"Full size: %Xh (%u)\nHuffman compressed: "
                 ,(ulong)uVar10,(ulong)uVar11);
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8,partition_3.d.field_2._8_8_);
        pcVar16 = "No";
        if (((uint)(pvVar19->ptEntry).Offset >> 0x19 & 1) != 0) {
          pcVar16 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_710,(CBString *)((long)&hash.d.field_2 + 8),pcVar16);
        Bstrlib::CBString::operator=((CBString *)local_140,&local_710);
        Bstrlib::CBString::~CBString(&local_710);
        Bstrlib::CBString::~CBString((CBString *)((long)&hash.d.field_2 + 8));
        UByteArray::UByteArray((UByteArray *)local_748,0x20,'\0');
        pcVar16 = UByteArray::constData((UByteArray *)local_630);
        iVar14 = UByteArray::size((UByteArray *)local_630);
        pcVar21 = UByteArray::data((UByteArray *)local_748);
        sha256(pcVar16,(long)iVar14,pcVar21);
        Bstrlib::CBString::CBString(&local_778,"\nMetadata hash: ");
        UByteArray::toHex((UByteArray *)&partitionIndex_1.m,(UByteArray *)local_748);
        pcVar16 = UByteArray::constData((UByteArray *)&partitionIndex_1.m);
        Bstrlib::CBString::CBString(&local_790,pcVar16);
        Bstrlib::CBString::operator+(&local_760,&local_778,&local_790);
        Bstrlib::CBString::operator+=((CBString *)local_140,&local_760);
        Bstrlib::CBString::~CBString(&local_760);
        Bstrlib::CBString::~CBString(&local_790);
        UByteArray::~UByteArray((UByteArray *)&partitionIndex_1.m);
        Bstrlib::CBString::~CBString(&local_778);
        UVar13 = parent_local._4_4_;
        pTVar4 = this->model;
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8,partition_3.d.field_2._8_8_);
        aVar2 = (pvVar19->ptEntry).Offset;
        Bstrlib::CBString::CBString(&local_7e0);
        UByteArray::UByteArray(&local_800);
        UByteArray::UByteArray(&local_820);
        TreeModel::addItem((UModelIndex *)local_7c8,pTVar4,UVar13 + ((uint)aVar2 & 0x1ffffff),'a',
                           0xe7,(CBString *)&info.super_tagbstring.data,&local_7e0,
                           (CBString *)local_140,&local_800,(UByteArray *)local_630,&local_820,Fixed
                           ,index_local,'\0');
        UByteArray::~UByteArray(&local_820);
        UByteArray::~UByteArray(&local_800);
        Bstrlib::CBString::~CBString(&local_7e0);
        parseCpdExtensionsArea(this,(UModelIndex *)local_7c8,0);
        UByteArray::~UByteArray((UByteArray *)local_748);
      }
      else {
        uVar10 = UByteArray::size((UByteArray *)local_630);
        uVar11 = UByteArray::size((UByteArray *)local_630);
        usprintf((CBString *)((long)&hash_1.d.field_2 + 8),
                 "Full size: %Xh (%u)\nHuffman compressed: ",(ulong)uVar10,(ulong)uVar11);
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8,partition_3.d.field_2._8_8_);
        pcVar16 = "No";
        if (((uint)(pvVar19->ptEntry).Offset >> 0x19 & 1) != 0) {
          pcVar16 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_838,(CBString *)((long)&hash_1.d.field_2 + 8),pcVar16);
        Bstrlib::CBString::operator=((CBString *)local_140,&local_838);
        Bstrlib::CBString::~CBString(&local_838);
        Bstrlib::CBString::~CBString((CBString *)((long)&hash_1.d.field_2 + 8));
        UByteArray::UByteArray((UByteArray *)local_870,0x20,'\0');
        pcVar16 = UByteArray::constData((UByteArray *)local_630);
        iVar14 = UByteArray::size((UByteArray *)local_630);
        pcVar21 = UByteArray::data((UByteArray *)local_870);
        sha256(pcVar16,(long)iVar14,pcVar21);
        Bstrlib::CBString::CBString(&local_8a0,"\nHash: ");
        UByteArray::toHex((UByteArray *)&codeIndex.m,(UByteArray *)local_870);
        pcVar16 = UByteArray::constData((UByteArray *)&codeIndex.m);
        Bstrlib::CBString::CBString(&local_8b8,pcVar16);
        Bstrlib::CBString::operator+(&local_888,&local_8a0,&local_8b8);
        Bstrlib::CBString::operator+=((CBString *)local_140,&local_888);
        Bstrlib::CBString::~CBString(&local_888);
        Bstrlib::CBString::~CBString(&local_8b8);
        UByteArray::~UByteArray((UByteArray *)&codeIndex.m);
        Bstrlib::CBString::~CBString(&local_8a0);
        UVar13 = parent_local._4_4_;
        pTVar4 = this->model;
        pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                            ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                             local_1a8,partition_3.d.field_2._8_8_);
        aVar2 = (pvVar19->ptEntry).Offset;
        Bstrlib::CBString::CBString(&local_908);
        UByteArray::UByteArray(&local_928);
        UByteArray::UByteArray((UByteArray *)((long)&partition_4.d.field_2 + 8));
        TreeModel::addItem((UModelIndex *)local_8f0,pTVar4,UVar13 + ((uint)aVar2 & 0x1ffffff),'a',
                           0xe9,(CBString *)&info.super_tagbstring.data,&local_908,
                           (CBString *)local_140,&local_928,(UByteArray *)local_630,
                           (UByteArray *)((long)&partition_4.d.field_2 + 8),Fixed,index_local,'\0');
        UByteArray::~UByteArray((UByteArray *)((long)&partition_4.d.field_2 + 8));
        UByteArray::~UByteArray(&local_928);
        Bstrlib::CBString::~CBString(&local_908);
        parseRawArea(this,(UModelIndex *)local_8f0);
        UByteArray::~UByteArray((UByteArray *)local_870);
      }
    }
    UByteArray::~UByteArray((UByteArray *)local_630);
  }
  else {
    pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                        ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                         local_1a8,partition_3.d.field_2._8_8_);
    pUVar7 = pUStack_48;
    if (pvVar19->type != '@') {
      usprintf(&local_a20,"%s: CPD partition of unknown type found","parseCpdRegion");
      msg(this,&local_a20,index_local);
      Bstrlib::CBString::~CBString(&local_a20);
      this_local = (FfsParser *)0xfd;
      local_39c = 1;
      goto LAB_00165036;
    }
    pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                        ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                         local_1a8,partition_3.d.field_2._8_8_);
    aVar2 = (pvVar19->ptEntry).Offset;
    pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                        ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                         local_1a8,partition_3.d.field_2._8_8_);
    UByteArray::mid((UByteArray *)local_968,pUVar7,(uint)aVar2 & 0x1ffffff,(pvVar19->ptEntry).Length
                   );
    Bstrlib::CBString::CBString(&local_980,"Padding");
    Bstrlib::CBString::operator=((CBString *)&info.super_tagbstring.data,&local_980);
    Bstrlib::CBString::~CBString(&local_980);
    uVar10 = UByteArray::size((UByteArray *)local_968);
    uVar11 = UByteArray::size((UByteArray *)local_968);
    usprintf(&local_998,"Full size: %Xh (%u)",(ulong)uVar10,(ulong)uVar11);
    Bstrlib::CBString::operator=((CBString *)local_140,&local_998);
    Bstrlib::CBString::~CBString(&local_998);
    UVar13 = parent_local._4_4_;
    pTVar4 = this->model;
    pvVar19 = std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::operator[]
                        ((vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> *)
                         local_1a8,partition_3.d.field_2._8_8_);
    aVar2 = (pvVar19->ptEntry).Offset;
    UVar8 = getPaddingType((UByteArray *)local_968);
    Bstrlib::CBString::CBString(&local_9b0);
    UByteArray::UByteArray(&local_9d0);
    UByteArray::UByteArray(&local_9f0);
    TreeModel::addItem(&local_a08,pTVar4,UVar13 + ((uint)aVar2 & 0x1ffffff),'@',UVar8,
                       (CBString *)&info.super_tagbstring.data,&local_9b0,(CBString *)local_140,
                       &local_9d0,(UByteArray *)local_968,&local_9f0,Fixed,index_local,'\0');
    UByteArray::~UByteArray(&local_9f0);
    UByteArray::~UByteArray(&local_9d0);
    Bstrlib::CBString::~CBString(&local_9b0);
    UByteArray::~UByteArray((UByteArray *)local_968);
  }
  partition_3.d.field_2._8_8_ = partition_3.d.field_2._8_8_ + 1;
  goto LAB_00163e50;
LAB_00165024:
  this_local = (FfsParser *)0x0;
  local_39c = 1;
  goto LAB_00165036;
}

Assistant:

USTATUS FfsParser::parseCpdRegion(const UByteArray & region, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index)
{
    // Check directory size
    if ((UINT32)region.size() < sizeof(CPD_REV1_HEADER)) {
        msg(usprintf("%s: CPD too small to fit rev1 partition table header", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Populate partition table header
    const CPD_REV1_HEADER* cpdHeader = (const CPD_REV1_HEADER*)region.constData();
    
    // Check header version to be known
    UINT32 ptHeaderSize = 0;
    if (cpdHeader->HeaderVersion == 2) {
        if ((UINT32)region.size() < sizeof(CPD_REV2_HEADER)) {
            msg(usprintf("%s: CPD too small to fit rev2 partition table header", __FUNCTION__), parent);
            return U_INVALID_ME_PARTITION_TABLE;
        }
        
        ptHeaderSize = sizeof(CPD_REV2_HEADER);
    }
    else if (cpdHeader->HeaderVersion == 1) {
        ptHeaderSize = sizeof(CPD_REV1_HEADER);
    }
    
    // Check directory size again
    UINT32 ptBodySize = cpdHeader->NumEntries * sizeof(CPD_ENTRY);
    UINT32 ptSize = ptHeaderSize + ptBodySize;
    if ((UINT32)region.size() < ptSize) {
        msg(usprintf("%s: CPD too small to fit the whole partition table", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Get info
    UByteArray header = region.left(ptHeaderSize);
    UByteArray body = region.mid(ptHeaderSize, ptBodySize);
    UString name = usprintf("CPD partition table");
    UString info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\n"
                            "Header version: %u\nEntry version: %u",
                            ptSize, ptSize,
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size(),
                            cpdHeader->NumEntries,
                            cpdHeader->HeaderVersion,
                            cpdHeader->EntryVersion);
    
    // Add tree item
    index = model->addItem(localOffset, Types::CpdStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, parent);
    
    // Add partition table entries
    std::vector<CPD_PARTITION_INFO> partitions;
    UINT32 offset = ptHeaderSize;
    const CPD_ENTRY* firstCpdEntry = (const CPD_ENTRY*)(body.constData());
    for (UINT32 i = 0; i < cpdHeader->NumEntries; i++) {
        // Populate entry header
        const CPD_ENTRY* cpdEntry = firstCpdEntry + i;
        UByteArray entry((const char*)cpdEntry, sizeof(CPD_ENTRY));
        
        // Get info
        name = usprintf("%.12s", cpdEntry->EntryName);
        info = usprintf("Full size: %Xh (%u)\nEntry offset: %Xh\nEntry length: %Xh\nHuffman compressed: ",
                        (UINT32)entry.size(), (UINT32)entry.size(),
                        cpdEntry->Offset.Offset,
                        cpdEntry->Length)
        + (cpdEntry->Offset.HuffmanCompressed ? "Yes" : "No");
        
        // Add tree item
        UModelIndex entryIndex = model->addItem(offset, Types::CpdEntry, 0, name, UString(), info, UByteArray(), entry, UByteArray(), Fixed, index);
        
        // Adjust offset
        offset += sizeof(CPD_ENTRY);
        
        if (cpdEntry->Offset.Offset != 0 && cpdEntry->Length != 0) {
            // Add to partitions vector
            CPD_PARTITION_INFO partition;
            partition.type = Types::CpdPartition;
            partition.ptEntry = *cpdEntry;
            partition.index = entryIndex;
            partition.hasMetaData = false;
            partitions.push_back(partition);
        }
    }
    
    // Add padding if there's no partions to add
    if (partitions.size() == 0) {
        UByteArray partition = region.mid(ptSize);
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)",
                        (UINT32)partition.size(), (UINT32)partition.size());
        
        // Add tree item
        model->addItem(localOffset + ptSize, Types::Padding, getPaddingType(partition), name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
        
        return U_SUCCESS;
    }
    
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Because lenghts for all Huffmann-compressed partitions mean nothing at all, we need to split all partitions into 2 classes:
    // 1. CPD manifest
    // 2. Metadata entries
    UINT32 i = 1; // manifest is index 0, .met partitions start at index 1
    while (i < partitions.size()) {
        name = usprintf("%.12s", partitions[i].ptEntry.EntryName);
        
        // Check if the current entry is metadata entry
        if (!name.endsWith(".met")) {
            // No need to parse further, all metadata partitions are parsed
            break;
        }
        
        // Parse into data block, find Module Attributes extension, and get compressed size from there
        UINT32 offset = 0;
        UINT32 length = 0xFFFFFFFF; // Special guardian value
        UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
        while (offset < (UINT32)partition.size()) {
            const CPD_EXTENTION_HEADER* extHeader = (const CPD_EXTENTION_HEADER*) (partition.constData() + offset);
            if (extHeader->Length <= ((UINT32)partition.size() - offset)) {
                if (extHeader->Type == CPD_EXT_TYPE_MODULE_ATTRIBUTES) {
                    const CPD_EXT_MODULE_ATTRIBUTES* attrHeader = (const CPD_EXT_MODULE_ATTRIBUTES*)(partition.constData() + offset);
                    length = attrHeader->CompressedSize;
                }
                offset += extHeader->Length;
            }
            else break;
        }
        
        // Search down for corresponding code partition
        // Construct its name by removing the .met suffix
        name.chop(4);
        
        // Search
        bool found = false;
        UINT32 j = 1;
        while (j < partitions.size()) {
            UString namej = usprintf("%.12s", partitions[j].ptEntry.EntryName);
            
            if (name == namej) {
                found = true;
                // Found it, update its Length if needed
                if (partitions[j].ptEntry.Offset.HuffmanCompressed) {
                    partitions[j].ptEntry.Length = length;
                }
                else if (length != 0xFFFFFFFF && partitions[j].ptEntry.Length != length) {
                    msg(usprintf("%s: partition size mismatch between partition table (%Xh) and partition metadata (%Xh)", __FUNCTION__,
                                 partitions[j].ptEntry.Length, length), partitions[j].index);
                    partitions[j].ptEntry.Length = length; // Believe metadata
                }
                partitions[j].hasMetaData = true;
                // No need to search further
                break;
            }
            // Check the next partition
            j++;
        }
        if (!found) {
            msg(usprintf("%s: no code partition", __FUNCTION__), partitions[i].index);
        }
        
        // Check the next partition
        i++;
    }
    
make_partition_table_consistent:
    if (partitions.empty()) {
        return U_INVALID_ME_PARTITION_TABLE;
    }
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Check for intersections and paddings between partitions
    CPD_PARTITION_INFO padding = {};
    
    // Check intersection with the partition table header
    if (partitions.front().ptEntry.Offset.Offset < ptSize) {
        msg(usprintf("%s: CPD partition has intersection with CPD partition table, skipped", __FUNCTION__),
            partitions.front().index);
        partitions.erase(partitions.begin());
        goto make_partition_table_consistent;
    }
    // Check for padding between partition table and the first partition
    else if (partitions.front().ptEntry.Offset.Offset > ptSize) {
        padding.ptEntry.Offset.Offset = ptSize;
        padding.ptEntry.Length = partitions.front().ptEntry.Offset.Offset - padding.ptEntry.Offset.Offset;
        padding.type = Types::Padding;
        partitions.insert(partitions.begin(), padding);
    }
    // Check for intersections/paddings between partitions
    for (size_t i = 1; i < partitions.size(); i++) {
        UINT32 previousPartitionEnd = partitions[i - 1].ptEntry.Offset.Offset + partitions[i - 1].ptEntry.Length;
        
        // Check that current region is fully present in the image
        if ((UINT64)partitions[i].ptEntry.Offset.Offset + (UINT64)partitions[i].ptEntry.Length > (UINT64)region.size()) {
            if ((UINT64)partitions[i].ptEntry.Offset.Offset >= (UINT64)region.size()) {
                msg(usprintf("%s: CPD partition is located outside of the opened image, skipped", __FUNCTION__), partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                if (!partitions[i].hasMetaData && partitions[i].ptEntry.Offset.HuffmanCompressed) {
                    msg(usprintf("%s: CPD partition is compressed but doesn't have metadata and can't fit into its region, length adjusted", __FUNCTION__),
                        partitions[i].index);
                }
                else {
                    msg(usprintf("%s: CPD partition can't fit into its region, truncated", __FUNCTION__), partitions[i].index);
                }
                partitions[i].ptEntry.Length = (UINT32)region.size() - (UINT32)partitions[i].ptEntry.Offset.Offset;
            }
        }
        
        // Check for intersection with previous partition
        if (partitions[i].ptEntry.Offset.Offset < previousPartitionEnd) {
            // Check if previous partition was compressed but did not have metadata
            if (!partitions[i - 1].hasMetaData && partitions[i - 1].ptEntry.Offset.HuffmanCompressed) {
                msg(usprintf("%s: CPD partition is compressed but doesn't have metadata, length adjusted", __FUNCTION__),
                    partitions[i - 1].index);
                partitions[i - 1].ptEntry.Length = (UINT32)partitions[i].ptEntry.Offset.Offset - (UINT32)partitions[i - 1].ptEntry.Offset.Offset;
                goto make_partition_table_consistent;
            }
            
            // Check if current partition is located inside previous one
            if (partitions[i].ptEntry.Offset.Offset + partitions[i].ptEntry.Length <= previousPartitionEnd) {
                msg(usprintf("%s: CPD partition is located inside another CPD partition, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: CPD partition intersects with previous one, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
        }
        // Check for padding between current and previous partitions
        else if (partitions[i].ptEntry.Offset.Offset > previousPartitionEnd) {
            padding.ptEntry.Offset.Offset = previousPartitionEnd;
            padding.ptEntry.Length = partitions[i].ptEntry.Offset.Offset - previousPartitionEnd;
            padding.type = Types::Padding;
            std::vector<CPD_PARTITION_INFO>::iterator iter = partitions.begin();
            std::advance(iter, i);
            partitions.insert(iter, padding);
        }
    }
    // Check for padding after the last region
    if ((UINT64)partitions.back().ptEntry.Offset.Offset + (UINT64)partitions.back().ptEntry.Length < (UINT64)region.size()) {
        padding.ptEntry.Offset.Offset = partitions.back().ptEntry.Offset.Offset + partitions.back().ptEntry.Length;
        padding.ptEntry.Length = (UINT32)region.size() - padding.ptEntry.Offset.Offset;
        padding.type = Types::Padding;
        partitions.push_back(padding);
    }
    
    // Partition map is consistent
    for (size_t i = 0; i < partitions.size(); i++) {
        if (partitions[i].type == Types::CpdPartition) {
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
            
            // Get info
            name = usprintf("%.12s", partitions[i].ptEntry.EntryName);
            
            // It's a manifest
            if (name.endsWith(".man")) {
                if (!partitions[i].ptEntry.Offset.HuffmanCompressed
                    && partitions[i].ptEntry.Length >= sizeof(CPD_MANIFEST_HEADER)) {
                    const CPD_MANIFEST_HEADER* manifestHeader = (const CPD_MANIFEST_HEADER*) partition.constData();
                    if (manifestHeader->HeaderId == ME_MANIFEST_HEADER_ID) {
                        UByteArray header = partition.left(manifestHeader->HeaderLength * sizeof(UINT32));
                        UByteArray body = partition.mid(manifestHeader->HeaderLength * sizeof(UINT32));
                        
                        info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)"
                                        "\nHeader type: %u\nHeader length: %Xh (%u)\nHeader version: %Xh\nFlags: %08Xh\nVendor: %Xh\n"
                                        "Date: %Xh\nSize: %Xh (%u)\nVersion: %u.%u.%u.%u\nSecurity version number: %u\nModulus size: %Xh (%u)\nExponent size: %Xh (%u)",
                                        (UINT32)partition.size(), (UINT32)partition.size(),
                                        (UINT32)header.size(), (UINT32)header.size(),
                                        (UINT32)body.size(), (UINT32)body.size(),
                                        manifestHeader->HeaderType,
                                        manifestHeader->HeaderLength * (UINT32)sizeof(UINT32), manifestHeader->HeaderLength * (UINT32)sizeof(UINT32),
                                        manifestHeader->HeaderVersion,
                                        manifestHeader->Flags,
                                        manifestHeader->Vendor,
                                        manifestHeader->Date,
                                        manifestHeader->Size * (UINT32)sizeof(UINT32), manifestHeader->Size * (UINT32)sizeof(UINT32),
                                        manifestHeader->VersionMajor, manifestHeader->VersionMinor, manifestHeader->VersionBugfix, manifestHeader->VersionBuild,
                                        manifestHeader->SecurityVersion,
                                        manifestHeader->ModulusSize * (UINT32)sizeof(UINT32), manifestHeader->ModulusSize * (UINT32)sizeof(UINT32),
                                        manifestHeader->ExponentSize * (UINT32)sizeof(UINT32), manifestHeader->ExponentSize * (UINT32)sizeof(UINT32));
                        
                        // Add tree item
                        UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition, Subtypes::ManifestCpdPartition, name, UString(), info, header, body, UByteArray(), Fixed, parent);
                        
                        // Parse data as extensions area
                        // Add the header size as a local offset
                        // Since the body starts after the header length
                        parseCpdExtensionsArea(partitionIndex, (UINT32)header.size());
                    }
                }
            }
            // It's a metadata
            else if (name.endsWith(".met")) {
                info = usprintf("Full size: %Xh (%u)\nHuffman compressed: ",
                                (UINT32)partition.size(), (UINT32)partition.size())
                + (partitions[i].ptEntry.Offset.HuffmanCompressed ? "Yes" : "No");
                
                // Calculate SHA256 hash over the metadata and add it to its info
                UByteArray hash(SHA256_HASH_SIZE, '\x00');
                sha256(partition.constData(), partition.size(), hash.data());
                info += UString("\nMetadata hash: ") + UString(hash.toHex().constData());
                
                // Add three item
                UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition,  Subtypes::MetadataCpdPartition, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
                
                // Parse data as extensions area
                parseCpdExtensionsArea(partitionIndex, 0);
            }
            // It's a code
            else {
                info = usprintf("Full size: %Xh (%u)\nHuffman compressed: ",
                                (UINT32)partition.size(), (UINT32)partition.size())
                + (partitions[i].ptEntry.Offset.HuffmanCompressed ? "Yes" : "No");
                
                // Calculate SHA256 hash over the code and add it to its info
                UByteArray hash(SHA256_HASH_SIZE, '\x00');
                sha256(partition.constData(), partition.size(), hash.data());
                info += UString("\nHash: ") + UString(hash.toHex().constData());
                
                UModelIndex codeIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition, Subtypes::CodeCpdPartition, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
                (void)parseRawArea(codeIndex);
            }
        }
        else if (partitions[i].type == Types::Padding) {
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)partition.size(), (UINT32)partition.size());
            
            // Add tree item
            model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::Padding, getPaddingType(partition), name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
        }
        else {
            msg(usprintf("%s: CPD partition of unknown type found", __FUNCTION__), parent);
            return U_INVALID_ME_PARTITION_TABLE;
        }
    }
    
    return U_SUCCESS;
}